

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactorRational::solveUleft
          (CLUFactorRational *this,Rational *vec,int *vecidx,Rational *rhs,int *rhsidx,int rhsn)

{
  rational_type *prVar1;
  long in_RCX;
  long lVar2;
  long in_RDX;
  long in_RSI;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_RDI;
  int *in_R8;
  int in_R9D;
  int m;
  VectorRational *rval;
  Rational *val;
  int *idx;
  int *rbeg;
  int *rlen;
  int *ridx;
  int *cperm;
  int *corig;
  int *rorig;
  int c;
  int r;
  int n;
  int k;
  int j;
  int i;
  Rational y;
  Rational x;
  undefined4 in_stack_fffffffffffffe18;
  int iVar3;
  undefined1 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  *in_stack_fffffffffffffe28;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffe40;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  *in_stack_fffffffffffffe48;
  int local_1a4;
  undefined4 local_19c;
  undefined1 *local_198;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_190;
  int *local_188;
  limb_pointer local_180;
  long local_178;
  limb_type local_170;
  limb_type local_168;
  long local_160;
  limb_pointer local_158;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138 [4];
  undefined1 local_128 [64];
  undefined1 local_e8 [68];
  int local_a4;
  int *local_a0;
  long local_98;
  long local_90;
  long local_88;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  long local_60;
  undefined1 *local_58;
  long local_50;
  long local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_30;
  long local_28;
  undefined1 *local_20;
  undefined4 *local_18;
  long local_10;
  undefined4 *local_8;
  
  local_78 = local_e8;
  local_a4 = in_R9D;
  local_a0 = in_R8;
  local_98 = in_RCX;
  local_90 = in_RDX;
  local_88 = in_RSI;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1e7651);
  local_70 = local_128;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1e766e);
  local_158 = in_RDI[2].m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.data;
  local_160 = *(long *)&in_RDI[2].m_backend.m_value.den.m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .field_0x18;
  local_168 = in_RDI[3].m_backend.m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.la[0];
  local_138[0] = 0;
  while (local_138[0] < local_a4) {
    enQueueMinRat(local_a0,local_138,*(int *)(local_168 + (long)local_a0[local_138[0]] * 4));
  }
  local_170 = in_RDI[6].m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.la[0];
  local_198 = (undefined1 *)
              ((long)&in_RDI[6].m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data + 8);
  prVar1 = &in_RDI[6].m_backend.m_value;
  local_178._0_4_ =
       (prVar1->den).m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_limbs;
  local_178._4_1_ =
       (prVar1->den).m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_sign;
  local_178._5_1_ =
       (prVar1->den).m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal;
  local_178._6_1_ =
       (prVar1->den).m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_alias;
  local_178._7_1_ =
       (prVar1->den).m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .field_0x17;
  local_180 = in_RDI[6].m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.data;
  local_144 = 0;
  while (0 < local_a4) {
    local_138[0] = deQueueMinRat(local_a0,&local_a4);
    local_14c = *(int *)(local_160 + (long)local_138[0] * 4);
    local_28 = local_98 + (long)local_14c * 0x40;
    local_20 = local_e8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=(&in_RDI->m_backend,
                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT17(in_stack_fffffffffffffe1f,
                            CONCAT16(in_stack_fffffffffffffe1e,
                                     CONCAT15(in_stack_fffffffffffffe1d,
                                              CONCAT14(in_stack_fffffffffffffe1c,
                                                       in_stack_fffffffffffffe18)))));
    local_19c = 0;
    local_10 = local_98 + (long)local_14c * 0x40;
    local_18 = &local_19c;
    local_8 = local_18;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=(&in_RDI->m_backend,
                CONCAT17(in_stack_fffffffffffffe1f,
                         CONCAT16(in_stack_fffffffffffffe1e,
                                  CONCAT15(in_stack_fffffffffffffe1d,
                                           CONCAT14(in_stack_fffffffffffffe1c,
                                                    in_stack_fffffffffffffe18)))));
    in_stack_fffffffffffffe1f =
         boost::multiprecision::operator!=
                   ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)in_stack_fffffffffffffe28,(int *)in_RDI);
    if ((bool)in_stack_fffffffffffffe1f) {
      local_148 = *(int *)((long)local_158 + (long)local_138[0] * 4);
      lVar2 = (long)local_144;
      local_144 = local_144 + 1;
      *(int *)(local_90 + lVar2 * 4) = local_148;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_RDI,
                   CONCAT13(in_stack_fffffffffffffe1f,
                            CONCAT12(in_stack_fffffffffffffe1e,
                                     CONCAT11(in_stack_fffffffffffffe1d,in_stack_fffffffffffffe1c)))
                  );
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::operator*=(in_stack_fffffffffffffe40,
                   (self_type *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      local_30 = local_88 + (long)local_148 * 0x40;
      local_38 = local_e8;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=(&in_RDI->m_backend,
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe1f,
                              CONCAT16(in_stack_fffffffffffffe1e,
                                       CONCAT15(in_stack_fffffffffffffe1d,
                                                CONCAT14(in_stack_fffffffffffffe1c,
                                                         in_stack_fffffffffffffe18)))));
      local_140 = *(int *)((long)local_180 + (long)local_148 * 4);
      local_188 = (int *)(local_170 + (long)local_140 * 4);
      local_190 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_RDI,
                               CONCAT13(in_stack_fffffffffffffe1f,
                                        CONCAT12(in_stack_fffffffffffffe1e,
                                                 CONCAT11(in_stack_fffffffffffffe1d,
                                                          in_stack_fffffffffffffe1c))));
      for (local_1a4 = *(int *)(local_178 + (long)local_148 * 4); local_1a4 != 0;
          local_1a4 = local_1a4 + -1) {
        local_13c = *local_188;
        local_48 = local_98 + (long)local_13c * 0x40;
        local_40 = local_128;
        local_188 = local_188 + 1;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=(&in_RDI->m_backend,
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe1f,
                                CONCAT16(in_stack_fffffffffffffe1e,
                                         CONCAT15(in_stack_fffffffffffffe1d,
                                                  CONCAT14(in_stack_fffffffffffffe1c,
                                                           in_stack_fffffffffffffe18)))));
        in_stack_fffffffffffffe1e =
             boost::multiprecision::operator==
                       ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffffe28,(int *)in_RDI);
        if ((bool)in_stack_fffffffffffffe1e) {
          boost::multiprecision::operator-
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,
                                          CONCAT15(in_stack_fffffffffffffe1d,
                                                   CONCAT14(in_stack_fffffffffffffe1c,
                                                            in_stack_fffffffffffffe18)))));
          local_190 = local_190 + 1;
          boost::multiprecision::operator*(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::operator=(in_stack_fffffffffffffe30,
                      (expression<boost::multiprecision::detail::negate,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void,_void>
                       *)in_stack_fffffffffffffe28);
          in_stack_fffffffffffffe3c = 0;
          in_stack_fffffffffffffe1d =
               boost::multiprecision::operator!=
                         ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)in_stack_fffffffffffffe28,(int *)in_RDI);
          if ((bool)in_stack_fffffffffffffe1d) {
            local_50 = local_98 + (long)local_13c * 0x40;
            local_58 = local_128;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=(&in_RDI->m_backend,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,
                                             CONCAT15(in_stack_fffffffffffffe1d,
                                                      CONCAT14(in_stack_fffffffffffffe1c,
                                                               in_stack_fffffffffffffe18)))));
            enQueueMinRat(local_a0,&local_a4,*(int *)(local_168 + (long)local_13c * 4));
          }
        }
        else {
          local_190 = local_190 + 1;
          boost::multiprecision::operator*
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffffe28,in_RDI);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::operator-=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_60 = local_98 + (long)local_13c * 0x40;
          local_68 = local_128;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=(&in_RDI->m_backend,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT17(in_stack_fffffffffffffe1f,
                                  CONCAT16(in_stack_fffffffffffffe1e,
                                           CONCAT15(in_stack_fffffffffffffe1d,
                                                    CONCAT14(in_stack_fffffffffffffe1c,
                                                             in_stack_fffffffffffffe18)))));
        }
      }
    }
  }
  iVar3 = local_144;
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x1e7bda);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x1e7be7);
  return iVar3;
}

Assistant:

inline int CLUFactorRational::solveUleft(Rational* vec, int* vecidx,
      Rational* rhs, int* rhsidx, int rhsn)
{
   Rational x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   Rational* val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMinRat(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   VectorRational& rval = u.row.val;

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMinRat(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(x != 0)
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.val.dim());
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(y != 0)
               {
                  rhs[j] = y;
                  enQueueMinRat(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               //               rhs[j] = ( y != 0 ) ? y : SOPLEX_MARKER;
               rhs[j] = y;
            }
         }
      }
   }

   return n;
}